

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.h
# Opt level: O2

void __thiscall
chrono::ChIntegrable::LoadResidual_F(ChIntegrable *this,ChVectorDynamic<> *R,double c)

{
  ChException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,
             "LoadResidual_F() not implemented, implicit integrators cannot be used. ",&local_39);
  ChException::ChException(this_00,&local_38);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

virtual void LoadResidual_F(ChVectorDynamic<>& R,  ///< result: the R residual, R += c*F
                                const double c         ///< a scaling factor
                                ) {
        throw ChException("LoadResidual_F() not implemented, implicit integrators cannot be used. ");
    }